

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_char_iterator_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::StringCharIteratorTest_test_has_next3_Test::
~StringCharIteratorTest_test_has_next3_Test(StringCharIteratorTest_test_has_next3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringCharIteratorTest, test_has_next3)
{
    StringCharIterator tok = StringCharIterator(",", ',');
    ASSERT_TRUE(tok.HasNext());
    tok.Next();
    ASSERT_TRUE(tok.HasNext());
    tok.Next();
    ASSERT_FALSE(tok.HasNext());
}